

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# tif_dir.c
# Opt level: O2

int TIFFDefaultDirectory(TIFF *tif)

{
  TIFFFieldArray *pTVar1;
  ulong uVar2;
  uint uVar3;
  ulong uVar4;
  
  pTVar1 = _TIFFGetFields();
  _TIFFSetupFields(tif,pTVar1);
  uVar3 = 0;
  _TIFFmemset(&tif->tif_dir,0,0x158);
  (tif->tif_dir).td_threshholding = 1;
  (tif->tif_dir).td_fillorder = 1;
  (tif->tif_dir).td_orientation = 1;
  (tif->tif_dir).td_samplesperpixel = 1;
  (tif->tif_dir).td_rowsperstrip = 0xffffffff;
  (tif->tif_dir).td_minsamplevalue = 0;
  (tif->tif_dir).td_maxsamplevalue = 1;
  (tif->tif_dir).td_resolutionunit = 2;
  (tif->tif_dir).td_planarconfig = 1;
  (tif->tif_dir).td_imagedepth = 1;
  (tif->tif_dir).td_tilewidth = 0;
  (tif->tif_dir).td_tilelength = 0;
  (tif->tif_dir).td_tiledepth = 1;
  (tif->tif_dir).td_ycbcrsubsampling[0] = 2;
  (tif->tif_dir).td_ycbcrsubsampling[1] = 2;
  (tif->tif_dir).td_ycbcrpositioning = 1;
  tif->tif_postdecode = _TIFFNoPostDecode;
  tif->tif_foundfield = (TIFFField *)0x0;
  (tif->tif_tagmethods).vsetfield = _TIFFVSetField;
  (tif->tif_tagmethods).vgetfield = _TIFFVGetField;
  (tif->tif_tagmethods).printdir = (TIFFPrintMethod)0x0;
  (tif->tif_dir).td_compression = 1;
  (tif->tif_dir).td_subfiletype = 0;
  (tif->tif_dir).td_bitspersample = 1;
  (tif->tif_dir).td_sampleformat = 1;
  (tif->tif_dir).td_extrasamples = 0;
  (tif->tif_dir).td_sampleinfo = (uint16_t *)0x0;
  uVar2 = tif->tif_nfieldscompat;
  if (uVar2 != 0) {
    while( true ) {
      uVar4 = (ulong)uVar3;
      pTVar1 = tif->tif_fieldscompat;
      if (uVar2 <= uVar4) break;
      if (pTVar1[uVar4].allocated_size != 0) {
        _TIFFfreeExt(tif,pTVar1[uVar4].fields);
        uVar2 = tif->tif_nfieldscompat;
      }
      uVar3 = uVar3 + 1;
    }
    _TIFFfreeExt(tif,pTVar1);
    tif->tif_fieldscompat = (TIFFFieldArray *)0x0;
    tif->tif_nfieldscompat = 0;
  }
  if (_TIFFextender != (TIFFExtendProc)0x0) {
    (*_TIFFextender)(tif);
  }
  TIFFSetField(tif,0x103,1);
  tif->tif_flags = tif->tif_flags & 0xfffffbf7;
  return 1;
}

Assistant:

int TIFFDefaultDirectory(TIFF *tif)
{
    register TIFFDirectory *td = &tif->tif_dir;
    const TIFFFieldArray *tiffFieldArray;

    tiffFieldArray = _TIFFGetFields();
    _TIFFSetupFields(tif, tiffFieldArray);

    _TIFFmemset(td, 0, sizeof(*td));
    td->td_fillorder = FILLORDER_MSB2LSB;
    td->td_bitspersample = 1;
    td->td_threshholding = THRESHHOLD_BILEVEL;
    td->td_orientation = ORIENTATION_TOPLEFT;
    td->td_samplesperpixel = 1;
    td->td_rowsperstrip = (uint32_t)-1;
    td->td_tilewidth = 0;
    td->td_tilelength = 0;
    td->td_tiledepth = 1;
#ifdef STRIPBYTECOUNTSORTED_UNUSED
    td->td_stripbytecountsorted = 1; /* Our own arrays always sorted. */
#endif
    td->td_resolutionunit = RESUNIT_INCH;
    td->td_sampleformat = SAMPLEFORMAT_UINT;
    td->td_imagedepth = 1;
    td->td_ycbcrsubsampling[0] = 2;
    td->td_ycbcrsubsampling[1] = 2;
    td->td_ycbcrpositioning = YCBCRPOSITION_CENTERED;
    tif->tif_postdecode = _TIFFNoPostDecode;
    tif->tif_foundfield = NULL;
    tif->tif_tagmethods.vsetfield = _TIFFVSetField;
    tif->tif_tagmethods.vgetfield = _TIFFVGetField;
    tif->tif_tagmethods.printdir = NULL;
    /* additional default values */
    td->td_planarconfig = PLANARCONFIG_CONTIG;
    td->td_compression = COMPRESSION_NONE;
    td->td_subfiletype = 0;
    td->td_minsamplevalue = 0;
    /* td_bitspersample=1 is always set in TIFFDefaultDirectory().
     * Therefore, td_maxsamplevalue has to be re-calculated in
     * TIFFGetFieldDefaulted(). */
    td->td_maxsamplevalue = 1; /* Default for td_bitspersample=1 */
    td->td_extrasamples = 0;
    td->td_sampleinfo = NULL;

    /*
     *  Give client code a chance to install their own
     *  tag extensions & methods, prior to compression overloads,
     *  but do some prior cleanup first.
     * (http://trac.osgeo.org/gdal/ticket/5054)
     */
    if (tif->tif_nfieldscompat > 0)
    {
        uint32_t i;

        for (i = 0; i < tif->tif_nfieldscompat; i++)
        {
            if (tif->tif_fieldscompat[i].allocated_size)
                _TIFFfreeExt(tif, tif->tif_fieldscompat[i].fields);
        }
        _TIFFfreeExt(tif, tif->tif_fieldscompat);
        tif->tif_nfieldscompat = 0;
        tif->tif_fieldscompat = NULL;
    }
    if (_TIFFextender)
        (*_TIFFextender)(tif);
    (void)TIFFSetField(tif, TIFFTAG_COMPRESSION, COMPRESSION_NONE);
    /*
     * NB: The directory is marked dirty as a result of setting
     * up the default compression scheme.  However, this really
     * isn't correct -- we want TIFF_DIRTYDIRECT to be set only
     * if the user does something.  We could just do the setup
     * by hand, but it seems better to use the normal mechanism
     * (i.e. TIFFSetField).
     */
    tif->tif_flags &= ~TIFF_DIRTYDIRECT;

    /*
     * As per http://bugzilla.remotesensing.org/show_bug.cgi?id=19
     * we clear the ISTILED flag when setting up a new directory.
     * Should we also be clearing stuff like INSUBIFD?
     */
    tif->tif_flags &= ~TIFF_ISTILED;

    return (1);
}